

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O2

void uss_stat(SftpServer *srv,SftpReplyBuilder *reply,ptrlen path,_Bool follow_symlinks)

{
  int iVar1;
  char *__ptr;
  code *pcVar2;
  stat *reply_00;
  undefined3 in_register_00000081;
  stat st;
  stat sStack_a8;
  
  reply_00 = &sStack_a8;
  __ptr = mkstr(path);
  if (CONCAT31(in_register_00000081,follow_symlinks) == 0) {
    pcVar2 = lstat;
  }
  else {
    pcVar2 = stat;
  }
  iVar1 = (*pcVar2)(__ptr);
  free(__ptr);
  if (iVar1 < 0) {
    uss_error((UnixSftpServer *)reply,(SftpReplyBuilder *)reply_00);
  }
  else {
    uss_reply_struct_stat(reply,&sStack_a8);
  }
  return;
}

Assistant:

static void uss_stat(SftpServer *srv, SftpReplyBuilder *reply,
                     ptrlen path, bool follow_symlinks)
{
    UnixSftpServer *uss = container_of(srv, UnixSftpServer, srv);
    struct stat st;

    char *pathstr = mkstr(path);
    int status = (follow_symlinks ? stat : lstat) (pathstr, &st);
    free(pathstr);

    if (status < 0) {
        uss_error(uss, reply);
    } else {
        uss_reply_struct_stat(reply, &st);
    }
}